

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

int __thiscall
DPhased::PhaseHelper(DPhased *this,sector_t *sector,int index,int light,sector_t *prev)

{
  sector_t_conflict *sector_00;
  int type;
  int local_5c;
  int numsteps;
  DPhased *pDStack_38;
  int baselevel;
  DPhased *l;
  sector_t *prev_local;
  int light_local;
  int index_local;
  sector_t *sector_local;
  DPhased *this_local;
  
  this_local._4_4_ = index;
  if ((sector != (sector_t *)0x0) && (sector->validcount != validcount)) {
    local_5c = light;
    if (sector->lightlevel != 0) {
      local_5c = (int)sector->lightlevel;
    }
    sector->validcount = validcount;
    if (index == 0) {
      this->m_BaseLevel = (BYTE)local_5c;
      pDStack_38 = this;
    }
    else {
      pDStack_38 = (DPhased *)DObject::operator_new((DObject *)0x48,(size_t)sector);
      DPhased(pDStack_38,sector,local_5c);
    }
    type = 3;
    if (sector->special == 3) {
      type = 4;
    }
    sector_00 = sector_t::NextSpecialSector(sector,type,(sector_t_conflict *)prev);
    this_local._4_4_ =
         PhaseHelper(this,(sector_t *)sector_00,index + 1,(uint)pDStack_38->m_BaseLevel,sector);
    pDStack_38->m_Phase = (BYTE)((((this_local._4_4_ - index) + -1) * 0x40) / this_local._4_4_);
    sector->special = 0;
  }
  return this_local._4_4_;
}

Assistant:

int DPhased::PhaseHelper (sector_t *sector, int index, int light, sector_t *prev)
{
	if (!sector || sector->validcount == validcount)
	{
		return index;
	}
	else
	{
		DPhased *l;
		int baselevel = sector->lightlevel ? sector->lightlevel : light;
		sector->validcount = validcount;

		if (index == 0)
		{
			l = this;
			m_BaseLevel = baselevel;
		}
		else
			l = new DPhased (sector, baselevel);

		int numsteps = PhaseHelper (sector->NextSpecialSector (
				sector->special == LightSequenceSpecial1 ?
					LightSequenceSpecial2 : LightSequenceSpecial1, prev),
				index + 1, l->m_BaseLevel, sector);
		l->m_Phase = ((numsteps - index - 1) * 64) / numsteps;

		sector->special = 0;

		return numsteps;
	}
}